

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pololu.h
# Opt level: O3

int GetValuePololu(POLOLU *pPololu,int channel,int *pValue)

{
  int iVar1;
  ssize_t sVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  uchar recvbuf [512];
  uchar sendbuf [512];
  timespec local_428 [32];
  undefined1 local_228 [512];
  
  uVar5 = 0;
  memset(local_228,0,0x200);
  local_228[0] = 0xaa;
  local_228[1] = (undefined1)pPololu->DeviceNumber;
  local_228[2] = 0x10;
  iVar1 = (pPololu->RS232Port).DevType;
  local_228[3] = (char)channel;
  if (iVar1 - 1U < 4) {
    iVar1 = (pPololu->RS232Port).s;
    do {
      sVar2 = send(iVar1,local_228 + uVar5,(ulong)(4 - (int)uVar5),0);
      if ((int)sVar2 < 1) {
        return 1;
      }
      uVar3 = (int)uVar5 + (int)sVar2;
      uVar5 = (ulong)uVar3;
    } while ((int)uVar3 < 4);
  }
  else {
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = *(int *)&(pPololu->RS232Port).hDev;
    uVar5 = 0;
    do {
      sVar2 = write(iVar1,local_228 + uVar5,(ulong)(4 - (int)uVar5));
      if ((int)sVar2 < 1) {
        return 1;
      }
      uVar3 = (int)uVar5 + (int)sVar2;
      uVar5 = (ulong)uVar3;
    } while (uVar3 < 4);
  }
  if ((pPololu->bSaveRawData != 0) && ((FILE *)pPololu->pfSaveFile != (FILE *)0x0)) {
    fwrite(local_228,4,1,(FILE *)pPololu->pfSaveFile);
    fflush((FILE *)pPololu->pfSaveFile);
  }
  local_428[0].tv_sec = 0;
  local_428[0].tv_nsec = 10000000;
  uVar5 = 0;
  nanosleep(local_428,(timespec *)0x0);
  memset(local_428,0,0x200);
  iVar1 = (pPololu->RS232Port).DevType;
  if (iVar1 - 1U < 4) {
    iVar1 = (pPololu->RS232Port).s;
    do {
      sVar2 = recv(iVar1,(void *)((long)&local_428[0].tv_sec + uVar5),(ulong)(2 - (int)uVar5),0);
      if ((int)sVar2 < 1) {
        return 1;
      }
      uVar3 = (int)uVar5 + (int)sVar2;
      uVar5 = (ulong)uVar3;
    } while ((int)uVar3 < 2);
  }
  else {
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = *(int *)&(pPololu->RS232Port).hDev;
    lVar6 = 0;
    do {
      iVar4 = (int)lVar6;
      sVar2 = read(iVar1,(void *)((long)&local_428[0].tv_sec + lVar6),(ulong)(2 - iVar4));
      if ((int)sVar2 < 1) {
        return 1;
      }
      lVar6 = 1;
    } while ((uint)(iVar4 + (int)sVar2) < 2);
  }
  if ((pPololu->bSaveRawData != 0) && ((FILE *)pPololu->pfSaveFile != (FILE *)0x0)) {
    fwrite(local_428,2,1,(FILE *)pPololu->pfSaveFile);
    fflush((FILE *)pPololu->pfSaveFile);
  }
  *pValue = (uint)(ushort)local_428[0].tv_sec;
  return 0;
}

Assistant:

inline int GetValuePololu(POLOLU* pPololu, int channel, int* pValue)
{
	unsigned char sendbuf[MAX_NB_BYTES_POLOLU];
	unsigned char recvbuf[MAX_NB_BYTES_POLOLU];
	int sendbuflen = 0;
	int recvbuflen = 0;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sendbuf[0] = (unsigned char)BAUD_RATE_INDICATION_BYTE_POLOLU;
	sendbuf[1] = (unsigned char)pPololu->DeviceNumber;
	sendbuf[2] = (unsigned char)(GET_POSITION_COMMAND_POLOLU & 0x7F);
	sendbuf[3] = (unsigned char)channel;
	sendbuflen = 4;

	if (WriteAllRS232Port(&pPololu->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pPololu->bSaveRawData)&&(pPololu->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pPololu->pfSaveFile);
		fflush(pPololu->pfSaveFile);
	}

	mSleep(10); // Added because sometimes there was a timeout on the read() 
	// (even though the data were available if read just after the timeout...)...

	// Prepare the buffer that should receive data from device.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = 2;

	if (ReadAllRS232Port(&pPololu->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pPololu->bSaveRawData)&&(pPololu->pfSaveFile))
	{
		fwrite(recvbuf, recvbuflen, 1, pPololu->pfSaveFile);
		fflush(pPololu->pfSaveFile);
	}

	// Display and analyze received data.
	//printf("Received : \"%s\"\n", recvbuf);
	*pValue = recvbuf[0] + 256*recvbuf[1];

	return EXIT_SUCCESS;
}